

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_math.c
# Opt level: O2

double tand(double angle)

{
  double dVar1;
  double dVar2;
  
  dVar1 = fmod(angle,360.0);
  dVar2 = 0.0;
  if (((dVar1 != 0.0) || (NAN(dVar1))) && ((ABS(dVar1) != 180.0 || (NAN(ABS(dVar1)))))) {
    dVar2 = 1.0;
    if (((dVar1 != 45.0) || (NAN(dVar1))) && ((dVar1 != 225.0 || (NAN(dVar1))))) {
      dVar2 = -1.0;
      if (((dVar1 != -135.0) || (NAN(dVar1))) && ((dVar1 != -315.0 || (NAN(dVar1))))) {
        dVar1 = tan(angle * 0.017453292519943295);
        return dVar1;
      }
    }
  }
  return dVar2;
}

Assistant:

double tand(double angle) {
    double resid;

    resid = fmod(angle, 360.0);
    if (resid == 0.0 || fabs(resid) == 180.0) {
        return 0.0;
    } else if (resid == 45.0 || resid == 225.0) {
        return 1.0;
    } else if (resid == -135.0 || resid == -315.0) {
        return -1.0;
    }

    return tan(angle * D2R);
}